

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall Compiler::instructionToBinary(Compiler *this,Instruction *ins)

{
  Operation OVar1;
  pair<int,_int> pVar2;
  long lVar3;
  string *psVar4;
  undefined1 *puVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  u4 param;
  char bytes [8];
  u2 param1;
  undefined1 uStack_51;
  int local_50;
  undefined1 local_4a [7];
  undefined1 uStack_43;
  undefined2 local_42;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  OVar1 = Instruction::getOpr(ins);
  p_Var6 = &ITCTable._M_t._M_impl.super__Rb_tree_header._M_header;
  if (ITCTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var6 = &ITCTable._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var7 = ITCTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)OVar1 <= (int)p_Var7[1]._M_color) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < (int)OVar1];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  p_Var7 = &ITCTable._M_t._M_impl.super__Rb_tree_header._M_header;
  if (((_Rb_tree_header *)p_Var6 != &ITCTable._M_t._M_impl.super__Rb_tree_header) &&
     (p_Var7 = &ITCTable._M_t._M_impl.super__Rb_tree_header._M_header,
     (int)p_Var6[1]._M_color <= (int)OVar1)) {
    p_Var7 = p_Var6;
  }
  if ((_Rb_tree_header *)p_Var7 == &ITCTable._M_t._M_impl.super__Rb_tree_header) {
    psVar4 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unvalid operation type","")
    ;
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_40,local_40 + local_38);
    *(undefined8 *)(psVar4 + 0x20) = 0;
    __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
  }
  std::ostream::write((char *)this->_wtr,(long)p_Var7[1]._M_parent);
  OVar1 = Instruction::getOpr(ins);
  switch(OVar1) {
  case ipush:
    pVar2 = Instruction::getParam(ins);
    local_50 = pVar2.first;
    lVar3 = 4;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    goto LAB_0011a212;
  default:
    goto switchD_0011a0b7_caseD_1;
  case loada:
    pVar2 = Instruction::getParam(ins);
    local_42 = (short)pVar2.first;
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_43)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    puVar5 = local_4a;
    std::ostream::write((char *)this->_wtr,(long)puVar5);
    pVar2 = Instruction::getParam(ins);
    local_50 = pVar2.second;
    lVar3 = 4;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
LAB_0011a212:
    poVar8 = this->_wtr;
    goto LAB_0011a2cb;
  case loadc:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case call:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case je:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jne:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jg:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jge:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jl:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jle:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    break;
  case jmp:
    pVar2 = Instruction::getParam(ins);
    local_50 = CONCAT22(local_50._2_2_,(short)pVar2.first);
    lVar3 = 2;
    puVar5 = local_4a;
    do {
      *puVar5 = (&uStack_51)[lVar3];
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  poVar8 = this->_wtr;
LAB_0011a2cb:
  std::ostream::write((char *)poVar8,(long)local_4a);
switchD_0011a0b7_caseD_1:
  return;
}

Assistant:

void Compiler::instructionToBinary(Instruction& ins) {
	if (auto it = ITCTable.find(ins.getOpr()); it != ITCTable.end()) {
		_wtr.write(it->second, 1);
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getOpr())
	{
	case Operation::ipush: {
		u4 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::loada: {
		u2 param1 = ins.getParam().first;
		writeNBytes(&param1, sizeof param1);
		u4 param2 = ins.getParam().second;
		writeNBytes(&param2, sizeof param2);
		break;
	}
	case Operation::loadc: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::call: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jmp: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::je: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jne: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jl: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jle: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jg: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jge: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	default:
		break;
	}
}